

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O0

int resolve_json_schema_list_predicate(char *predicate,lys_node_list *list,int *parsed)

{
  long *plVar1;
  int iVar2;
  ushort **ppuVar3;
  lys_node *key;
  int i;
  int has_predicate;
  int nam_len;
  int mod_name_len;
  char *name;
  char *mod_name;
  int *parsed_local;
  lys_node_list *list_local;
  char *predicate_local;
  
  mod_name = (char *)parsed;
  parsed_local = (int *)list;
  list_local = (lys_node_list *)predicate;
  key._0_4_ = parse_schema_json_predicate
                        (predicate,&name,&has_predicate,(char **)&nam_len,&i,(char **)0x0,(int *)0x0
                         ,(int *)((long)&key + 4));
  if (((int)(uint)key < 1) || (iVar2 = strncmp(_nam_len,".",(long)i), iVar2 == 0)) {
    ly_vlog((ly_ctx *)**(undefined8 **)(parsed_local + 0xc),LYE_PATH_INCHAR,LY_VLOG_NONE,(void *)0x0
            ,(ulong)(uint)(int)(char)list_local->hash[(long)(int)-(uint)key + -0x68],
            list_local->hash + (long)(int)-(uint)key + -0x68);
    predicate_local._4_4_ = -1;
  }
  else {
    list_local = (lys_node_list *)(list_local->hash + (long)(int)(uint)key + -0x68);
    *(uint *)mod_name = (uint)key + *(int *)mod_name;
    ppuVar3 = __ctype_b_loc();
    if (((*ppuVar3)[(int)*_nam_len] & 0x800) == 0) {
      for (key._0_4_ = 0; (int)(uint)key < (int)(uint)*(byte *)((long)parsed_local + 0x1e);
          key._0_4_ = (uint)key + 1) {
        plVar1 = *(long **)(*(long *)(parsed_local + 0x22) + (long)(int)(uint)key * 8);
        iVar2 = strncmp((char *)*plVar1,_nam_len,(long)i);
        if ((iVar2 == 0) && (*(char *)(*plVar1 + (long)i) == '\0')) break;
      }
      if ((uint)key == *(byte *)((long)parsed_local + 0x1e)) {
        ly_vlog((ly_ctx *)**(undefined8 **)(parsed_local + 0xc),LYE_PATH_INKEY,LY_VLOG_NONE,
                (void *)0x0,_nam_len);
        return -1;
      }
    }
    if (key._4_4_ == 0) {
      predicate_local._4_4_ = 0;
    }
    else {
      predicate_local._4_4_ =
           resolve_json_schema_list_predicate
                     ((char *)list_local,(lys_node_list *)parsed_local,(int *)mod_name);
    }
  }
  return predicate_local._4_4_;
}

Assistant:

static int
resolve_json_schema_list_predicate(const char *predicate, const struct lys_node_list *list, int *parsed)
{
    const char *mod_name, *name;
    int mod_name_len, nam_len, has_predicate, i;
    struct lys_node *key;

    if (((i = parse_schema_json_predicate(predicate, &mod_name, &mod_name_len, &name, &nam_len, NULL, NULL, &has_predicate)) < 1)
            || !strncmp(name, ".", nam_len)) {
        LOGVAL(list->module->ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, predicate[-i], &predicate[-i]);
        return -1;
    }

    predicate += i;
    *parsed += i;

    if (!isdigit(name[0])) {
        for (i = 0; i < list->keys_size; ++i) {
            key = (struct lys_node *)list->keys[i];
            if (!strncmp(key->name, name, nam_len) && !key->name[nam_len]) {
                break;
            }
        }

        if (i == list->keys_size) {
            LOGVAL(list->module->ctx, LYE_PATH_INKEY, LY_VLOG_NONE, NULL, name);
            return -1;
        }
    }

    /* more predicates? */
    if (has_predicate) {
        return resolve_json_schema_list_predicate(predicate, list, parsed);
    }

    return 0;
}